

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::verify
          (ShaderAtomicXorCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  Hex<8UL> hex;
  uint uVar11;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Hex<8UL> hex_02;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int localNdx;
  long lVar19;
  Hex<8UL> hex_03;
  bool bVar20;
  int in_stack_00000008;
  long in_stack_00000010;
  int local_1f4;
  undefined1 local_1b0 [384];
  
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar11 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar4 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar11;
  uVar10 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar10 = 0xffff;
  }
  if (PVar2 == PRECISION_HIGHP) {
    uVar10 = 0xffffffff;
  }
  iVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = uVar4 & 0xffffffff;
  }
  iVar12 = (int)sig;
  uVar18 = 0;
  local_1f4 = iVar12;
  do {
    lVar19 = 1;
    if (uVar18 == uVar9) {
LAB_0124e63e:
      return (int)CONCAT71((int7)(int3)(uVar4 >> 8),(long)(int)uVar4 <= (long)uVar18);
    }
    iVar15 = (int)uVar18;
    uVar13 = *(uint *)(in_stack_00000010 + iVar15 * in_stack_00000008);
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar13;
    uVar3 = *(uint *)(siglen + (long)(int)(uVar11 * iVar15 * iVar12));
    hex_02.value._4_4_ = 0;
    hex_02.value._0_4_ = uVar3;
    iVar16 = local_1f4;
    bVar20 = (this->super_ShaderAtomicOpCase).m_initialValue == 0;
    for (; lVar19 < (int)uVar11; lVar19 = lVar19 + 1) {
      bVar20 = (bool)(bVar20 ^ *(int *)(siglen + (long)iVar16) == 0);
      iVar16 = iVar16 + iVar12;
    }
    uVar17 = ~uVar3;
    uVar5 = uVar17;
    if (!bVar20) {
      uVar5 = uVar3;
    }
    if (((uVar5 ^ uVar13) & uVar10) != 0) {
      local_1b0._0_8_ =
           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,iVar15);
      std::operator<<((ostream *)poVar1,": expected ");
      tcu::Format::operator<<((ostream *)poVar1,hex_02);
      std::operator<<((ostream *)poVar1," or ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = uVar17;
      tcu::Format::operator<<((ostream *)poVar1,hex_00);
      std::operator<<((ostream *)poVar1," (compare mask ");
      hex_01.value._4_4_ = 0;
      hex_01.value._0_4_ = uVar10;
      tcu::Format::operator<<((ostream *)poVar1,hex_01);
      std::operator<<((ostream *)poVar1,"), got ");
      tcu::Format::operator<<((ostream *)poVar1,hex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0124e639:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      goto LAB_0124e63e;
    }
    uVar14 = uVar8;
    iVar16 = -1;
    iVar6 = iVar7;
    while (bVar20 = uVar14 != 0, uVar14 = uVar14 - 1, bVar20) {
      lVar19 = (long)iVar6;
      hex_03.value._4_4_ = 0;
      hex_03.value._0_4_ = *(uint *)(tbslen + lVar19);
      iVar16 = iVar16 + 1;
      iVar6 = iVar6 + (int)tbs;
      uVar13 = *(uint *)(tbslen + lVar19) & uVar10;
      if ((((uVar13 != 0) && (uVar13 != uVar10)) && (uVar13 != (uVar3 & uVar10))) &&
         (uVar13 != (uVar17 & uVar10))) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,iVar15);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,iVar16);
        std::operator<<((ostream *)poVar1,": found unexpected value ");
        tcu::Format::operator<<((ostream *)poVar1,hex_03);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0124e639;
      }
    }
    uVar18 = uVar18 + 1;
    local_1f4 = local_1f4 + uVar11 * iVar12;
    iVar7 = iVar7 + uVar11 * (int)tbs;
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			const deUint32	randomValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*groupOffset);
			const deUint32	expected0		= randomValue ^ 0u;
			const deUint32	expected1		= randomValue ^ ~0u;
			int				numXorZeros		= (m_initialValue == 0) ? 1 : 0;

			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				if (inputValue == 0)
					numXorZeros += 1;
			}

			const deUint32 expected = (numXorZeros%2 == 0) ? expected0 : expected1;

			if ((groupOutput & compareMask) != (expected & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expected0)
													   << " or " << tcu::toHex(expected1) << " (compare mask " << tcu::toHex(compareMask)
													   << "), got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((outputValue & compareMask) != 0 &&
					(outputValue & compareMask) != compareMask &&
					(outputValue & compareMask) != (expected0&compareMask) &&
					(outputValue & compareMask) != (expected1&compareMask))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}